

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O2

void skip_buffer_input_data(j_decompress_ptr cinfo,long num_bytes)

{
  jpeg_source_mgr *pjVar1;
  ulong uVar2;
  unsigned_long uVar3;
  runtime_error *this;
  size_t sVar4;
  long num_bytes_local;
  
  num_bytes_local = num_bytes;
  if (-1 < num_bytes) {
    uVar3 = QIntC::IntConverter<long,_unsigned_long,_true,_false>::convert(&num_bytes_local);
    if (uVar3 != 0) {
      pjVar1 = cinfo->src;
      uVar2 = pjVar1->bytes_in_buffer;
      sVar4 = uVar2 - uVar3;
      if (uVar2 < uVar3) {
        pjVar1->next_input_byte = pjVar1->next_input_byte + uVar2;
        sVar4 = 0;
      }
      else {
        pjVar1->next_input_byte = pjVar1->next_input_byte + uVar3;
      }
      pjVar1->bytes_in_buffer = sVar4;
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this,"reading jpeg: jpeg library requested skipping a negative number of bytes");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void
skip_buffer_input_data(j_decompress_ptr cinfo, long num_bytes)
{
    if (num_bytes < 0) {
        throw std::runtime_error(
            "reading jpeg: jpeg library requested skipping a negative number of bytes");
    }
    size_t to_skip = QIntC::to_size(num_bytes);
    if ((to_skip > 0) && (to_skip <= cinfo->src->bytes_in_buffer)) {
        cinfo->src->next_input_byte += to_skip;
        cinfo->src->bytes_in_buffer -= to_skip;
    } else if (to_skip != 0) {
        cinfo->src->next_input_byte += cinfo->src->bytes_in_buffer;
        cinfo->src->bytes_in_buffer = 0;
    }
}